

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Synth::storeChanValues(V2Synth *this,int chan)

{
  byte bVar1;
  int iVar2;
  V2Sound *pVVar3;
  int i;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  syVChan *para;
  uint8_t *puVar7;
  float fVar8;
  float fVar9;
  
  if ((uint)chan < 0x10) {
    pVVar3 = getpatch(this,(uint)this->chans[(uint)chan].pgm);
    para = this->chansv + (uint)chan;
    iVar2 = this->voicemap[(uint)chan];
    for (lVar4 = 0; lVar4 != 0x1d; lVar4 = lVar4 + 1) {
      (&para->chanvol)[lVar4] = (float)pVVar3->chan[lVar4];
    }
    puVar7 = &pVVar3->modmatrix[0].dest;
    for (uVar6 = 0; uVar6 < pVVar3->modnum; uVar6 = uVar6 + 1) {
      if (0xe2 < (byte)(*puVar7 + 0xa8)) {
        uVar5 = *puVar7 - 0x3b;
        bVar1 = puVar7[-1];
        fVar9 = (&para->chanvol)[uVar5];
        fVar8 = getmodsource(this,this->voicesw + iVar2,chan,(uint)((V2Mod *)(puVar7 + -2))->source)
        ;
        fVar9 = fVar8 * ((float)bVar1 + -64.0) * 0.015625 + fVar9;
        fVar8 = 128.0;
        if (fVar9 <= 128.0) {
          fVar8 = fVar9;
        }
        (&para->chanvol)[uVar5] = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar8);
      }
      puVar7 = puVar7 + 3;
    }
    V2Chan::set(this->chansw + (uint)chan,para);
    return;
  }
  __assert_fail("chan >= 0 && chan < CHANS",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0xc26,"void V2Synth::storeChanValues(int)");
}

Assistant:

void storeChanValues(int chan)
    {
        assert(chan >= 0 && chan < CHANS);

        // get patch definition
        const V2Sound *patch = getpatch(chans[chan].pgm);

        // chan data
        syVChan *cpara = &chansv[chan];
        float *cparaf = (float *)cpara;
        V2Chan *cwork = &chansw[chan];
        V2Voice *voice = &voicesw[voicemap[chan]];

        // copy channel dependent data
        for (int i = 0; i < COUNTOF(patch->chan); i++)
            cparaf[i] = (float)patch->chan[i];

        // modulation matrix
        for (int i = 0; i < patch->modnum; i++)
        {
            const V2Mod *mod = &patch->modmatrix[i];
            int dest = mod->dest - COUNTOF(patch->voice);
            if (dest < 0 || dest >= COUNTOF(patch->chan))
                continue;

            float scale = (mod->val - 64.0f) / 64.0f;
            cparaf[dest] = clamp(cparaf[dest] + scale*getmodsource(voice, chan, mod->source), 0.0f, 128.0f);
        }

        cwork->set(cpara);
    }